

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.cpp
# Opt level: O0

void __thiscall PseudoTopoOrder::FillDP(PseudoTopoOrder *this)

{
  int iVar1;
  bool bVar2;
  node_t nVar3;
  weight_t wVar4;
  size_type sVar5;
  reference pvVar6;
  reference pNVar7;
  ostream *poVar8;
  void *this_00;
  int iVar9;
  vector<int,_std::allocator<int>_> *in_RDI;
  double dVar10;
  int candidate;
  value_type j;
  NeighborNode v;
  const_iterator __end2;
  const_iterator __begin2;
  vector<NeighborNode,_std::allocator<NeighborNode>_> *__range2;
  vector<NeighborNode,_std::allocator<NeighborNode>_> *neigh;
  int u;
  int best_val;
  int n;
  undefined4 in_stack_ffffffffffffff88;
  node_t in_stack_ffffffffffffff8c;
  DiGraph *in_stack_ffffffffffffff90;
  NeighborNode local_40;
  NeighborNode *local_38;
  __normal_iterator<const_NeighborNode_*,_std::vector<NeighborNode,_std::allocator<NeighborNode>_>_>
  local_30;
  vector<NeighborNode,_std::allocator<NeighborNode>_> *local_28;
  vector<NeighborNode,_std::allocator<NeighborNode>_> *local_20;
  value_type local_14;
  int local_10;
  int local_c;
  
  sVar5 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
  local_c = (int)sVar5;
  local_10 = 0;
  if (*(int *)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start <
      *(int *)((long)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 4)) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_RDI + 2,
                        (long)*(int *)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start);
    local_10 = *pvVar6;
  }
  while (*(int *)((long)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) < local_c) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_RDI,(long)*(int *)((long)&in_RDI[4].
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start + 4));
    local_14 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_RDI + 2,
                        (long)*(int *)((long)&in_RDI[4].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + 4));
    *pvVar6 = 0;
    local_28 = DiGraph::inneighbors(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    local_20 = local_28;
    local_30._M_current =
         (NeighborNode *)
         std::vector<NeighborNode,_std::allocator<NeighborNode>_>::begin
                   ((vector<NeighborNode,_std::allocator<NeighborNode>_> *)
                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_38 = (NeighborNode *)
               std::vector<NeighborNode,_std::allocator<NeighborNode>_>::end
                         ((vector<NeighborNode,_std::allocator<NeighborNode>_> *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_NeighborNode_*,_std::vector<NeighborNode,_std::allocator<NeighborNode>_>_>
                               *)in_stack_ffffffffffffff90,
                              (__normal_iterator<const_NeighborNode_*,_std::vector<NeighborNode,_std::allocator<NeighborNode>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
          bVar2) {
      pNVar7 = __gnu_cxx::
               __normal_iterator<const_NeighborNode_*,_std::vector<NeighborNode,_std::allocator<NeighborNode>_>_>
               ::operator*(&local_30);
      local_40 = *pNVar7;
      nVar3 = NeighborNode::operator_cast_to_int(&local_40);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 1,(long)nVar3);
      iVar1 = *pvVar6;
      if (iVar1 < *(int *)((long)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + 4)) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 2,(long)iVar1);
        iVar9 = *pvVar6;
        wVar4 = NeighborNode::Weight(&local_40);
        iVar9 = iVar9 + wVar4;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_RDI + 2,
                            (long)*(int *)((long)&in_RDI[4].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4));
        if (*pvVar6 < iVar9) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_RDI + 2,
                              (long)*(int *)((long)&in_RDI[4].
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start + 4));
          *pvVar6 = iVar9;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_RDI + 3,
                              (long)*(int *)((long)&in_RDI[4].
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start + 4));
          *pvVar6 = iVar1;
          if (local_10 < iVar9) {
            *(undefined4 *)
             &in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                 *(undefined4 *)
                  ((long)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 4);
            local_10 = iVar9;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_NeighborNode_*,_std::vector<NeighborNode,_std::allocator<NeighborNode>_>_>
      ::operator++(&local_30);
    }
    *(int *)((long)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 4) =
         *(int *)((long)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) + 1;
  }
  if (*(int *)&in_RDI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start < local_10) {
    poVar8 = std::operator<<((ostream *)&std::cout,"PTO improved path to ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_10);
    poVar8 = std::operator<<(poVar8," at ");
    dVar10 = TimeFromStart();
    this_00 = (void *)std::ostream::operator<<(poVar8,dVar10);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    *(int *)&in_RDI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start = local_10;
  }
  return;
}

Assistant:

void PseudoTopoOrder::FillDP()
{
	int n = pto.size();
	int best_val = 0;

	if (best_index < first_unknown)
	{
		best_val = dynamic_programming[best_index];
	}

// 	std::cout << "\nAt the beginning of filldp, first unknown: " << first_unknown << "/" << n << " and value of bestindex = " << dynamic_programming[best_index] << std::endl;
	for ( ; first_unknown < n; ++first_unknown)
	{
		int u = pto[first_unknown];
		dynamic_programming[first_unknown] = 0;

		auto& neigh = m_parent.inneighbors(u);

		for (auto v : neigh)
		{
			auto j = pto_inverse[v];

			if (first_unknown <= j)   // should be ignored
			{
				continue;
			}

			auto candidate = dynamic_programming[j] + v.Weight();

			if (candidate > dynamic_programming[first_unknown])
			{
				dynamic_programming[first_unknown] = candidate;
				best_parent[first_unknown] = j;

				if (candidate > best_val)
				{
// 					cout << "Fill: new best value at " << i << " with value " << best_val << endl;
					best_val = candidate;
					best_index = first_unknown;
				}
			}
		}
	}
	if (best_val > global_best)
	{
		std::cout << "PTO improved path to " << best_val << " at " << TimeFromStart() << std::endl;
		global_best = best_val;
	}

// 	std::cout << "\nreturning value: " << best_val << " = " << dynamic_programming[best_index] << std::endl;
}